

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

size_t __thiscall flexbuffers::Builder::String(Builder *this,char *str,size_t len)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  iterator iVar4;
  StringOffset so;
  key_type local_38;
  
  puVar1 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = CreateBlob(this,str,len,1,FBT_STRING);
  if ((this->flags_ & BUILDER_FLAG_SHARE_STRINGS) != BUILDER_FLAG_NONE) {
    local_38.first = sVar3;
    local_38.second = len;
    iVar4 = std::
            _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_std::_Identity<std::pair<unsigned_long,_unsigned_long>_>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::find(&(this->string_pool)._M_t,&local_38);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->string_pool)._M_t._M_impl.super__Rb_tree_header)
    {
      std::
      _Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>,std::_Identity<std::pair<unsigned_long,unsigned_long>>,flexbuffers::Builder::StringOffsetCompare,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::_M_insert_unique<std::pair<unsigned_long,unsigned_long>const&>
                ((_Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>,std::_Identity<std::pair<unsigned_long,unsigned_long>>,flexbuffers::Builder::StringOffsetCompare,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)&this->string_pool,&local_38);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->buf_,(long)puVar1 - (long)puVar2);
      sVar3 = *(size_t *)(iVar4._M_node + 1);
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].field_0.i_ = sVar3;
    }
  }
  return sVar3;
}

Assistant:

size_t String(const char *str, size_t len) {
    auto reset_to = buf_.size();
    auto sloc = CreateBlob(str, len, 1, FBT_STRING);
    if (flags_ & BUILDER_FLAG_SHARE_STRINGS) {
      StringOffset so(sloc, len);
      auto it = string_pool.find(so);
      if (it != string_pool.end()) {
        // Already in the buffer. Remove string we just serialized, and use
        // existing offset instead.
        buf_.resize(reset_to);
        sloc = it->first;
        stack_.back().u_ = sloc;
      } else {
        string_pool.insert(so);
      }
    }
    return sloc;
  }